

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O0

bool __thiscall
AutoArgParse::FlagStore::tryParseFlag
          (FlagStore *this,ArgIter *first,ArgIter *last,Policy *foundFlagPolicy)

{
  bool bVar1;
  reference pbVar2;
  pointer ppVar3;
  ParseToken *this_00;
  RepeatedFlagException *this_01;
  pointer pFVar4;
  string local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
  local_38;
  iterator flagIter;
  Policy *foundFlagPolicy_local;
  ArgIter *last_local;
  ArgIter *first_local;
  FlagStore *this_local;
  
  flagIter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
               )foundFlagPolicy;
  pbVar2 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(first);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>_>
       ::find(&this->flags,pbVar2);
  local_40._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<std::__cxx11::string,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>>>
                 (&this->flags);
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
                           *)&local_38);
    this_00 = &std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
               ::operator->(&ppVar3->second)->super_ParseToken;
    bVar1 = ParseToken::parsed(this_00);
    if (bVar1) {
      this_01 = (RepeatedFlagException *)__cxa_allocate_exception(0x50);
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(first);
      std::__cxx11::string::string((string *)&local_60,(string *)pbVar2);
      RepeatedFlagException::RepeatedFlagException(this_01,&local_60);
      __cxa_throw(this_01,&RepeatedFlagException::typeinfo,
                  RepeatedFlagException::~RepeatedFlagException);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(first);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
                           *)&local_38);
    pFVar4 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
             operator->(&ppVar3->second);
    (*(pFVar4->super_ParseToken)._vptr_ParseToken[2])(pFVar4,first,last);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
                           *)&local_38);
    pFVar4 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
             operator->(&ppVar3->second);
    *(Policy *)
     flagIter.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
     ._M_cur = (pFVar4->super_ParseToken).policy;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

AUTOARGPARSE_INLINE bool FlagStore::tryParseFlag(ArgIter& first, ArgIter& last,
                                                 Policy& foundFlagPolicy) {
    auto flagIter = flags.find(*first);
    if (flagIter != end(flags)) {
        if (flagIter->second->parsed()) {
            throw RepeatedFlagException(*first);
        }
        ++first;
        flagIter->second->parse(first, last);
        foundFlagPolicy = flagIter->second->policy;
        return true;
    } else {
        return false;
    }
}